

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O0

err_t belsShare3(octet *si,size_t count,size_t threshold,size_t len,octet *s)

{
  bool_t bVar1;
  err_t eVar2;
  blob_t pvVar3;
  size_t in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  void *in_R8;
  gen_i unaff_retaddr;
  octet *in_stack_00000008;
  err_t code;
  void *state;
  void *in_stack_00000040;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((((in_RCX == 0x10) || (in_RCX == 0x18)) || (in_RCX == 0x20)) &&
     (bVar1 = memIsValid(in_R8,in_RCX), bVar1 != 0)) {
    belsGenk_keep();
    pvVar3 = blobCreate(in_stack_ffffffffffffffb8);
    if (pvVar3 == (blob_t)0x0) {
      return 0x6e;
    }
    belsGenkStart(unaff_retaddr,
                  (octet *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                  in_RSI,in_RDX);
    eVar2 = belsShare2((octet *)threshold,len,(size_t)s,(size_t)state,in_stack_00000008,
                       unaff_retaddr,in_stack_00000040);
    blobClose((blob_t)0x132844);
    return eVar2;
  }
  return 0x6d;
}

Assistant:

err_t belsShare3(octet si[], size_t count, size_t threshold, size_t len,
	const octet s[])
{
	void* state;
	err_t code;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || !memIsValid(s, len)) 
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(belsGenk_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// запустить генератор
	belsGenkStart(state, s, count, threshold, len);
	// разделить секрет
	code = belsShare2(si, count, threshold, len, s, belsGenkStepR, state);
	// завершение
	blobClose(state);
	return code;
}